

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupRemapLiterals(Vec_Int_t *vLits,Gia_Man_t *p)

{
  uint Lit;
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int i;
  
  for (i = 0; i < vLits->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vLits,i);
    if (-1 < iVar1) {
      iVar2 = Abc_Lit2Var(iVar1);
      pGVar3 = Gia_ManObj(p,iVar2);
      Lit = pGVar3->Value;
      iVar2 = -1;
      if (Lit != 0xffffffff) {
        iVar1 = Abc_LitIsCompl(iVar1);
        iVar2 = Abc_LitNotCond(Lit,iVar1);
      }
      Vec_IntWriteEntry(vLits,i,iVar2);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Removes pointers to the unmarked nodes..]

  Description [Array vLits contains literals of p. At the same time, 
  each object pObj of p points to a literal of pNew. This procedure
  remaps literals in array vLits into literals of pNew.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManDupRemapLiterals( Vec_Int_t * vLits, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, iLit, iLitNew;
    Vec_IntForEachEntry( vLits, iLit, i )
    {
        if ( iLit < 0 )
            continue;
        pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( ~pObj->Value == 0 )
            iLitNew = -1;
        else
            iLitNew = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(iLit) );
        Vec_IntWriteEntry( vLits, i, iLitNew );
    }
}